

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O3

void __thiscall
soplex::
SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::memPack(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  DLPSV *pDVar12;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar13;
  int newsize;
  long lVar14;
  
  pDVar12 = (this->list).
            super_IsList<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            .the_first;
  if (pDVar12 == (DLPSV *)0x0) {
    newsize = 0;
  }
  else {
    pNVar13 = (this->
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ).data;
    newsize = 0;
    do {
      uVar3 = (pDVar12->
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).memused;
      if ((pDVar12->
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_elem == pNVar13 + newsize) {
        (pDVar12->
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).memsize = uVar3;
      }
      else {
        if (0 < (int)uVar3) {
          lVar14 = 0;
          do {
            pNVar13 = (pDVar12->
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_elem;
            pNVar4 = (this->
                     super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ).data;
            puVar2 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar14);
            uVar5 = *puVar2;
            uVar6 = puVar2[1];
            puVar2 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar14 + 0x10);
            uVar7 = *puVar2;
            uVar8 = puVar2[1];
            puVar2 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar14 + 0x20);
            uVar9 = *puVar2;
            uVar10 = puVar2[1];
            puVar2 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar14 + 0x30);
            uVar11 = puVar2[1];
            puVar1 = (undefined8 *)
                     ((long)pNVar4[newsize].val.m_backend.data._M_elems + lVar14 + 0x30);
            *puVar1 = *puVar2;
            puVar1[1] = uVar11;
            puVar2 = (undefined8 *)
                     ((long)pNVar4[newsize].val.m_backend.data._M_elems + lVar14 + 0x20);
            *puVar2 = uVar9;
            puVar2[1] = uVar10;
            puVar2 = (undefined8 *)
                     ((long)pNVar4[newsize].val.m_backend.data._M_elems + lVar14 + 0x10);
            *puVar2 = uVar7;
            puVar2[1] = uVar8;
            puVar2 = (undefined8 *)((long)pNVar4[newsize].val.m_backend.data._M_elems + lVar14);
            *puVar2 = uVar5;
            puVar2[1] = uVar6;
            *(undefined4 *)((long)(&pNVar4[newsize].val.m_backend.data + 1) + lVar14) =
                 *(undefined4 *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar14);
            *(undefined1 *)((long)(&pNVar4[newsize].val.m_backend.data + 1) + lVar14 + 4) =
                 *(undefined1 *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar14 + 4U);
            *(undefined8 *)((long)(&pNVar4[newsize].val.m_backend.data + 1) + lVar14 + 8) =
                 *(undefined8 *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar14 + 8U);
            *(undefined4 *)((long)(&pNVar4[newsize].val + 1) + lVar14) =
                 *(undefined4 *)((long)(&pNVar13->val + 1) + lVar14);
            lVar14 = lVar14 + 0x54;
          } while ((ulong)uVar3 * 0x54 - lVar14 != 0);
          pNVar13 = (this->
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ).data;
        }
        (pDVar12->
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_elem = pNVar13 + newsize;
        (pDVar12->
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).memsize = uVar3;
        (pDVar12->
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).memused = uVar3;
      }
      newsize = newsize + uVar3;
    } while (((this->list).
              super_IsList<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
              .the_last != pDVar12) && (pDVar12 = pDVar12->thenext, pDVar12 != (DLPSV *)0x0));
  }
  ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reSize(&this->
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ,newsize);
  this->unusedMem = 0;
  this->numUnusedMemUpdates = 0;
  return;
}

Assistant:

void memPack()
   {
      DLPSV* ps;
      int used;
      int j;

      for(used = 0, ps = list.first(); ps; ps = list.next(ps))
      {
         const int sz = ps->size();

         if(ps->mem() != &this->SVSetBaseArray::operator[](used))
         {
            // cannot use memcpy, because the memory might overlap
            for(j = 0; j < sz; ++j)
               this->SVSetBaseArray::operator[](used + j) = ps->mem()[j];

            ps->setMem(sz, &this->SVSetBaseArray::operator[](used));
            ps->set_size(sz);
         }
         else
            ps->set_max(sz);

         used += sz;
      }

#ifdef SOPLEX_DEBUG
      SPxOut::debug(this,
                    "counting unused memory (unusedMem = {}, numUnusedMemUpdates = {}, this = {})\n", unusedMem,
                    numUnusedMemUpdates, (void*)this);
      SPxOut::debug(this,
                    "               --> NEW: unusedMem = {}, zero after memPack() at memMax() = {}\n",
                    memSize() - used, memMax());
#endif
#ifndef NDEBUG
      Nonzero<R>* olddata = SVSetBaseArray::data;
      SVSetBaseArray::reSize(used);
      assert(olddata == SVSetBaseArray::data);
#else
      SVSetBaseArray::reSize(used);
#endif

      unusedMem = 0;
      numUnusedMemUpdates = 0;
   }